

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  char *pcVar1;
  cmMakefile *pcVar2;
  ostream *poVar3;
  bool bVar4;
  bool bVar5;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  ostringstream m;
  bool isError;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  cmListFileArgument a;
  Delimiter delim_local;
  cmListFileLexer_Token *token_local;
  cmListFileParser *this_local;
  
  pcVar1 = token->text;
  a.Line._4_4_ = delim;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
  cmListFileArgument::cmListFileArgument
            ((cmListFileArgument *)local_58,&local_78,a.Line._4_4_,(long)token->line);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
            (&(this->Function).Arguments,(value_type *)local_58);
  if (this->Separation == SeparationOkay) {
    this_local._7_1_ = true;
  }
  else {
    bVar4 = this->Separation == SeparationError;
    bVar5 = a.Line._4_4_ == Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    poVar3 = std::operator<<((ostream *)local_210,"Syntax ");
    pcVar1 = "CMake Warning";
    if (bVar4 || bVar5) {
      pcVar1 = "CMake Error";
    }
    poVar3 = std::operator<<(poVar3,pcVar1 + 6);
    poVar3 = std::operator<<(poVar3," in cmake code at\n");
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = std::operator<<(poVar3,this->FileName);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,token->line);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,token->column);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Argument not separated from preceding token by whitespace.");
    this_local._7_1_ = !bVar4 && !bVar5;
    if (this_local._7_1_) {
      pcVar2 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
    }
    else {
      pcVar2 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  }
  cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  cmListFileArgument a(token->text, delim, token->line);
  this->Function.Arguments.push_back(a);
  if(this->Separation == SeparationOkay)
    {
    return true;
    }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  m << "Syntax " << (isError? "Error":"Warning") << " in cmake code at\n"
    << "  " << this->FileName << ":" << token->line << ":"
    << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  if(isError)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }
  else
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    return true;
    }
}